

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void highbd_transpose4x8_8x4_low_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3)

{
  __m128i alVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  alVar1 = *x0;
  auVar7._0_12_ = alVar1._0_12_;
  auVar7._12_2_ = alVar1[0]._6_2_;
  auVar7._14_2_ = *(undefined2 *)((long)*x1 + 6);
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_10_ = alVar1._0_10_;
  auVar6._10_2_ = *(undefined2 *)((long)*x1 + 4);
  auVar5._10_6_ = auVar6._10_6_;
  auVar5._0_8_ = alVar1[0];
  auVar5._8_2_ = alVar1[0]._4_2_;
  auVar2._4_8_ = auVar5._8_8_;
  auVar2._2_2_ = *(undefined2 *)((long)*x1 + 2);
  auVar2._0_2_ = alVar1[0]._2_2_;
  auVar4._0_4_ = CONCAT22((short)(*x1)[0],(short)alVar1[0]);
  auVar4._4_12_ = auVar2;
  alVar1 = *x2;
  auVar11._0_12_ = alVar1._0_12_;
  auVar11._12_2_ = alVar1[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)*x3 + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar1._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)*x3 + 4);
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = alVar1[0];
  auVar9._8_2_ = alVar1[0]._4_2_;
  auVar3._4_8_ = auVar9._8_8_;
  auVar3._2_2_ = *(undefined2 *)((long)*x3 + 2);
  auVar3._0_2_ = alVar1[0]._2_2_;
  auVar12._0_8_ = auVar4._0_8_;
  auVar12._8_4_ = auVar2._0_4_;
  auVar12._12_4_ = auVar3._0_4_;
  auVar8._0_8_ = CONCAT44(auVar9._8_4_,auVar5._8_4_);
  auVar8._8_4_ = auVar6._12_4_;
  auVar8._12_4_ = auVar10._12_4_;
  (*d0)[0] = CONCAT44(CONCAT22((short)(*x3)[0],(short)alVar1[0]),auVar4._0_4_);
  (*d0)[1] = 0;
  (*d1)[0] = auVar12._8_8_;
  (*d1)[1] = 0;
  (*d2)[0] = auVar8._0_8_;
  (*d2)[1] = 0;
  *d3 = (__m128i)(auVar8 >> 0x40);
  return;
}

Assistant:

static inline void highbd_transpose4x8_8x4_low_sse2(__m128i *x0, __m128i *x1,
                                                    __m128i *x2, __m128i *x3,
                                                    __m128i *d0, __m128i *d1,
                                                    __m128i *d2, __m128i *d3) {
  __m128i zero = _mm_setzero_si128();
  __m128i w0, w1, ww0, ww1;

  w0 = _mm_unpacklo_epi16(*x0, *x1);  // 00 10 01 11 02 12 03 13
  w1 = _mm_unpacklo_epi16(*x2, *x3);  // 20 30 21 31 22 32 23 33

  ww0 = _mm_unpacklo_epi32(w0, w1);  // 00 10 20 30 01 11 21 31
  ww1 = _mm_unpackhi_epi32(w0, w1);  // 02 12 22 32 03 13 23 33

  *d0 = _mm_unpacklo_epi64(ww0, zero);  // 00 10 20 30 xx xx xx xx
  *d1 = _mm_unpackhi_epi64(ww0, zero);  // 01 11 21 31 xx xx xx xx
  *d2 = _mm_unpacklo_epi64(ww1, zero);  // 02 12 22 32 xx xx xx xx
  *d3 = _mm_unpackhi_epi64(ww1, zero);  // 03 13 23 33 xx xx xx xx
}